

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::BindingImageTest::prepareTexture
          (BindingImageTest *this,texture *texture,buffer *buffer,TEXTURE_TYPES texture_type,
          GLuint color,GLuint unit)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  sockaddr *psVar2;
  uint uVar3;
  sockaddr *__addr;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = 0x600;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_data,0x600);
  psVar2 = (sockaddr *)
           ((long)texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2);
  for (uVar3 = 0; __addr = (sockaddr *)(ulong)uVar3, __addr < psVar2; uVar3 = uVar3 + 1) {
    texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[(long)__addr] = color;
  }
  if (texture_type == TEX_BUFFER) {
    Utils::buffer::bind(buffer,iVar1,__addr,(socklen_t)psVar2);
    Utils::texture::createBuffer(texture,0x8058,buffer->m_id);
  }
  else {
    Utils::texture::create(texture,0x10,0x10,6,0x8058,texture_type);
    Utils::texture::update
              (texture,0x10,0x10,6,0x1908,0x1401,
               texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (texture_type < TEXTURE_TYPES_MAX) {
      uVar4 = 0x100010101000000 >> ((byte)(texture_type << 3) & 0x3f);
      goto LAB_00a62e1c;
    }
  }
  uVar4 = 0;
LAB_00a62e1c:
  iVar1 = (*((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x80))
            (unit,texture->m_id,0,uVar4 & 0xff,0,0x88ba,0x8058);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x962);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void BindingImageTest::prepareTexture(Utils::texture& texture, const Utils::buffer& buffer,
									  Utils::TEXTURE_TYPES texture_type, GLuint color, GLuint unit)
{
	std::vector<GLuint> texture_data;
	texture_data.resize(m_width * m_height * m_depth);

	GLboolean is_layered = GL_FALSE;

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = color;
	}

	if (Utils::TEX_BUFFER != texture_type)
	{
		texture.create(m_width, m_height, m_depth, GL_RGBA8, texture_type);

		texture.update(m_width, m_height, m_depth, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);
	}
	else
	{
		buffer.bind();

		texture.createBuffer(GL_RGBA8, buffer.m_id);
	}

	switch (texture_type)
	{
	case Utils::TEX_1D_ARRAY:
	case Utils::TEX_2D_ARRAY:
	case Utils::TEX_3D:
	case Utils::TEX_CUBE:
		is_layered = GL_TRUE;
		break;
	default:
		break;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindImageTexture(unit, texture.m_id, 0 /* level */, is_layered /* layered */, 0 /* layer */, GL_READ_WRITE,
						GL_RGBA8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
}